

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.hxx
# Opt level: O0

void __thiscall nuraft::srv_config::srv_config(srv_config *this,int32 id,string *endpoint)

{
  string *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 10));
  *(undefined1 *)(in_RDI + 0x12) = 0;
  in_RDI[0x13] = 1;
  return;
}

Assistant:

srv_config(int32 id, const std::string& endpoint)
        : id_(id)
        , dc_id_(0)
        , endpoint_(endpoint)
        , learner_(false)
        , priority_(INIT_PRIORITY)
        {}